

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetActiveIdUsingNavAndKeys(void)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if (GImGui->ActiveId != 0) {
    GImGui->ActiveIdUsingNavDirMask = 0xffffffff;
    pIVar1->ActiveIdUsingNavInputMask = 0xffffffff;
    *(undefined4 *)&pIVar1->ActiveIdUsingKeyInputMask = 0xffffffff;
    *(undefined4 *)((long)&pIVar1->ActiveIdUsingKeyInputMask + 4) = 0xffffffff;
    NavMoveRequestCancel();
    return;
  }
  __assert_fail("g.ActiveId != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x1494,"void ImGui::SetActiveIdUsingNavAndKeys()");
}

Assistant:

void ImGui::SetActiveIdUsingNavAndKeys()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId != 0);
    g.ActiveIdUsingNavDirMask = ~(ImU32)0;
    g.ActiveIdUsingNavInputMask = ~(ImU32)0;
    g.ActiveIdUsingKeyInputMask = ~(ImU64)0;
    NavMoveRequestCancel();
}